

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<unsigned_long,_char,_3>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *t,char *u,unsigned_long *result)

{
  ulong uVar1;
  uint32_t uVar2;
  ulong *in_RDX;
  char *in_RSI;
  ulong *in_RDI;
  
  if (*in_RSI == '\0') {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*in_RSI < '\0') {
    uVar1 = *in_RDI;
    uVar2 = AbsValueHelper<char,_0>::Abs('\0');
    *in_RDX = uVar1 % (ulong)uVar2;
  }
  else {
    *in_RDX = *in_RDI % (ulong)(long)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        // u could be negative - if so, need to convert to positive
        if(u < 0)
            result = (T)(t % AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ));
        else
            result = (T)(t % u);
    }